

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::
initiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper::
~initiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
          (initiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
           *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIX.4.2" + delimSOH
  + "35=A" + delimSOH
  + "9=114" + delimSOH
  + "34=2" + delimSOH
  + "49=ISLD" + delimSOH
  + "56=TW" + delimSOH
  + "52=20190517-16:08:43" + delimSOH
  + "98=0" + delimSOH
  + "108=1" + delimSOH
  + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);

}